

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

SchnorrPubkey * __thiscall
cfd::core::SchnorrPubkey::operator+=
          (SchnorrPubkey *__return_storage_ptr__,SchnorrPubkey *this,ByteData256 *right)

{
  SchnorrPubkey key;
  SchnorrPubkey local_30;
  
  CreateTweakAdd(&local_30,this,right,(bool *)0x0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::operator+=(const ByteData256 &right) {
  SchnorrPubkey key = CreateTweakAdd(right);
  *this = key;
  return *this;
}